

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode ** Cudd_bddCharToVect(DdManager *dd,DdNode *f)

{
  DdNode **__ptr;
  DdNode *local_38;
  DdNode *res;
  DdNode **vect;
  int j;
  int i;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_38 = (DdNode *)0x0;
  if (f != (DdNode *)((ulong)dd->one ^ 1)) {
    __ptr = (DdNode **)malloc((long)dd->size << 3);
    if (__ptr != (DdNode **)0x0) {
      do {
        dd->reordered = 0;
        vect._4_4_ = 0;
        while( true ) {
          if (dd->size <= vect._4_4_) goto LAB_00a7d4a6;
          local_38 = cuddBddCharToVect(dd,f,dd->vars[dd->invperm[vect._4_4_]]);
          if (local_38 == (DdNode *)0x0) break;
          *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4) + 1;
          __ptr[dd->invperm[vect._4_4_]] = local_38;
          vect._4_4_ = vect._4_4_ + 1;
        }
        for (vect._0_4_ = 0; (int)vect < vect._4_4_; vect._0_4_ = (int)vect + 1) {
          Cudd_IterDerefBdd(dd,__ptr[dd->invperm[(int)vect]]);
        }
LAB_00a7d4a6:
        if (dd->reordered != 1) {
          if (local_38 == (DdNode *)0x0) {
            if (__ptr != (DdNode **)0x0) {
              free(__ptr);
            }
            return (DdNode **)0x0;
          }
          return __ptr;
        }
      } while( true );
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode **)0x0;
}

Assistant:

DdNode **
Cudd_bddCharToVect(
  DdManager * dd,
  DdNode * f)
{
    int i, j;
    DdNode **vect;
    DdNode *res = NULL;

    if (f == Cudd_Not(DD_ONE(dd))) return(NULL);

    vect = ABC_ALLOC(DdNode *, dd->size);
    if (vect == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    do {
        dd->reordered = 0;
        for (i = 0; i < dd->size; i++) {
            res = cuddBddCharToVect(dd,f,dd->vars[dd->invperm[i]]);
            if (res == NULL) {
                /* Clean up the vector array in case reordering took place. */
                for (j = 0; j < i; j++) {
                    Cudd_IterDerefBdd(dd, vect[dd->invperm[j]]);
                }
                break;
            }
            cuddRef(res);
            vect[dd->invperm[i]] = res;
        }
    } while (dd->reordered == 1);
    if (res == NULL) {
        ABC_FREE(vect);
        return(NULL);
    }
    return(vect);

}